

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_finished(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  size_t *psVar1;
  ptls_buffer_t *buf;
  ptls_key_schedule_t *ppVar2;
  size_t sVar3;
  uint8_t *puVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  ptls_hash_context_t **pppVar11;
  
  iVar6 = (*emitter->begin_message)(emitter);
  if (iVar6 != 0) {
    return iVar6;
  }
  buf = emitter->buf;
  ppVar2 = tls->key_schedule;
  sVar3 = buf->off;
  iVar6 = ptls_buffer_reserve(buf,1);
  bVar5 = true;
  if (iVar6 == 0) {
    buf->base[buf->off] = '\x14';
    buf->off = buf->off + 1;
    iVar6 = ptls_buffer_reserve(buf,3);
    bVar5 = true;
    if (iVar6 == 0) {
      puVar4 = buf->base;
      sVar10 = buf->off;
      puVar4[sVar10 + 2] = '\0';
      puVar4 = puVar4 + sVar10;
      puVar4[0] = '\0';
      puVar4[1] = '\0';
      sVar10 = buf->off;
      buf->off = sVar10 + 3;
      iVar6 = ptls_buffer_reserve(emitter->buf,(tls->key_schedule->hashes[0].algo)->digest_size);
      if ((iVar6 == 0) &&
         (iVar6 = calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,
                                   &(tls->traffic_protection).enc), iVar6 == 0)) {
        psVar1 = &emitter->buf->off;
        *psVar1 = *psVar1 + (tls->key_schedule->hashes[0].algo)->digest_size;
        uVar7 = buf->off - (sVar10 + 3);
        lVar8 = 0x10;
        do {
          buf->base[sVar10] = (uint8_t)(uVar7 >> ((byte)lVar8 & 0x3f));
          lVar8 = lVar8 + -8;
          sVar10 = sVar10 + 1;
        } while (lVar8 != -8);
        bVar5 = false;
        iVar6 = (int)CONCAT71((int7)(uVar7 >> 8),1);
      }
      else {
        iVar6 = 0;
      }
    }
    else {
      iVar6 = 0;
    }
    if ((char)iVar6 != '\0') {
      bVar5 = false;
      if ((ppVar2 != (ptls_key_schedule_t *)0x0) && (bVar5 = false, ppVar2->num_hashes != 0)) {
        puVar4 = buf->base;
        sVar10 = buf->off;
        pppVar11 = &ppVar2->hashes[0].ctx;
        bVar5 = false;
        sVar9 = 0;
        do {
          iVar6 = (*(*pppVar11)->update)(*pppVar11,puVar4 + sVar3,sVar10 - sVar3);
          sVar9 = sVar9 + 1;
          pppVar11 = pppVar11 + 2;
        } while (sVar9 != ppVar2->num_hashes);
      }
    }
  }
  if (bVar5) {
    return iVar6;
  }
  iVar6 = (*emitter->commit_message)(emitter);
  return iVar6;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
        if ((ret = ptls_buffer_reserve(emitter->buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = calc_verify_data(emitter->buf->base + emitter->buf->off, tls->key_schedule,
                                    tls->traffic_protection.enc.secret)) != 0)
            goto Exit;
        emitter->buf->off += tls->key_schedule->hashes[0].algo->digest_size;
    });

Exit:
    return ret;
}